

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapshotExtractor.cpp
# Opt level: O2

void __thiscall TTD::SnapshotExtractor::MarkVisitVar(SnapshotExtractor *this,Var var)

{
  long *plVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  int iVar5;
  RecyclableObject *pRVar6;
  undefined4 *puVar7;
  DynamicObject *pDVar8;
  RecyclableObject *local_30;
  RecyclableObject *obj;
  
  if (var == (Var)0x0) {
    TTDAbort_unrecoverable_error("I don\'t think this should happen but not 100% sure.");
  }
  bVar3 = Js::TaggedInt::Is(var);
  if ((ulong)var >> 0x32 == 0 && !bVar3) {
    pRVar6 = Js::UnsafeVarTo<Js::RecyclableObject>(var);
    if (pRVar6 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                         ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_00854d62;
      *puVar7 = 0;
    }
    if (0x57 < (int)((pRVar6->type).ptr)->typeId) {
      BVar4 = Js::RecyclableObject::IsExternal(pRVar6);
      if (BVar4 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                           ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                           "GetTypeId aValue has invalid TypeId");
        if (!bVar3) {
LAB_00854d62:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar7 = 0;
      }
      pRVar6 = Js::VarTo<Js::RecyclableObject>(var);
      BVar4 = Js::RecyclableObject::IsExternal(pRVar6);
      if (BVar4 == 0) {
        TTDAbort_unrecoverable_error("Not cool.");
      }
    }
  }
  bVar3 = JsSupport::IsVarTaggedInline(var);
  if (!bVar3) {
    bVar3 = JsSupport::IsVarPrimitiveKind(var);
    if (bVar3) {
      bVar3 = MarkTable::MarkAndTestAddr<(TTD::MarkTableTag)3>(&this->m_marks,var);
      if (bVar3) {
        pRVar6 = Js::VarTo<Js::RecyclableObject>(var);
        MarkVisitType(this,(pRVar6->type).ptr);
        return;
      }
    }
    else {
      bVar3 = JsSupport::IsVarComplexKind(var);
      if (!bVar3) {
        TTDAbort_unrecoverable_error("Shouldn\'t be anything else");
      }
      bVar3 = MarkTable::MarkAndTestAddr<(TTD::MarkTableTag)4>(&this->m_marks,var);
      if (bVar3) {
        pRVar6 = Js::VarTo<Js::RecyclableObject>(var);
        local_30 = pRVar6;
        bVar3 = Js::DynamicType::Is(((pRVar6->type).ptr)->typeId);
        if (bVar3) {
          pDVar8 = Js::VarTo<Js::DynamicObject,Js::RecyclableObject>(pRVar6);
          iVar5 = (**(code **)(**(long **)((pDVar8->super_RecyclableObject).type.ptr + 1) + 0x268))
                            ();
          if (iVar5 != 0) {
            plVar1 = *(long **)((pDVar8->super_RecyclableObject).type.ptr + 1);
            (**(code **)(*plVar1 + 0x80))(plVar1,pDVar8);
          }
        }
        MarkVisitType(this,(pRVar6->type).ptr);
        DList<Js::RecyclableObject_*,_Memory::HeapAllocator,_RealCount>::Append
                  (&(this->m_worklist).list,&local_30);
      }
    }
  }
  return;
}

Assistant:

void SnapshotExtractor::MarkVisitVar(Js::Var var)
    {
        TTDAssert(var != nullptr, "I don't think this should happen but not 100% sure.");
        TTDAssert(Js::JavascriptOperators::GetTypeId(var) < Js::TypeIds_Limit || Js::VarTo<Js::RecyclableObject>(var)->IsExternal(), "Not cool.");

        //We don't need to visit tagged things
        if(JsSupport::IsVarTaggedInline(var))
        {
            return;
        }

        if(JsSupport::IsVarPrimitiveKind(var))
        {
            if(this->m_marks.MarkAndTestAddr<MarkTableTag::PrimitiveObjectTag>(var))
            {
                Js::RecyclableObject* obj = Js::VarTo<Js::RecyclableObject>(var);
                this->MarkVisitType(obj->GetType());
            }
        }
        else
        {
            TTDAssert(JsSupport::IsVarComplexKind(var), "Shouldn't be anything else");

            if(this->m_marks.MarkAndTestAddr<MarkTableTag::CompoundObjectTag>(var))
            {
                Js::RecyclableObject* obj = Js::VarTo<Js::RecyclableObject>(var);

                //do this here instead of in mark visit type as it wants the dynamic object as well
                if(Js::DynamicType::Is(obj->GetTypeId()))
                {
                    Js::DynamicObject* dynObj = Js::VarTo<Js::DynamicObject>(obj);
                    if(dynObj->GetDynamicType()->GetTypeHandler()->IsDeferredTypeHandler())
                    {
                        dynObj->GetDynamicType()->GetTypeHandler()->EnsureObjectReady(dynObj);
                    }
                }
                this->MarkVisitType(obj->GetType());

                this->m_worklist.Enqueue(obj);
            }
        }
    }